

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<void_const_volatile*,void_const*>::emplace<void_const*const&>
          (QHash<void_const_volatile*,void_const*> *this,void **key,void **args)

{
  Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QHash<const_volatile_void_*,_const_void_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *)0x0) {
    local_28.d = (Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *)0x0;
LAB_003886bd:
    pDVar1 = (Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *)0x0;
LAB_003886de:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_>::detached
                       (pDVar1);
    *(Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> **)this = pDVar1;
LAB_003886e6:
    pVar2 = (piter)emplace_helper<void_const*const&>(this,key,args);
    QHash<const_volatile_void_*,_const_void_*>::~QHash(&local_28);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_28.d = pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *)0x0)
        goto LAB_003886bd;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_003886de;
      goto LAB_003886e6;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar2 = (piter)emplace_helper<void_const*const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_00388765;
    }
    local_28.d = (Data *)*args;
    pVar2 = (piter)emplace_helper<void_const*>(this,key,&local_28.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_00388765:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }